

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAddqEa<(moira::Instr)7,(moira::Mode)2,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  byte bVar3;
  u32 val;
  u32 data;
  u32 ea;
  u32 local_20;
  u32 local_1c;
  
  bVar1 = readOp<(moira::Mode)2,(moira::Size)1,0ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar1) {
    bVar3 = 8;
    if ((opcode & 0xe00) != 0) {
      bVar3 = (byte)(opcode >> 9) & 7;
    }
    val = bVar3 + local_20;
    bVar1 = (bool)((byte)(val >> 8) & 1);
    (this->reg).sr.c = bVar1;
    (this->reg).sr.x = bVar1;
    bVar3 = (byte)val;
    (this->reg).sr.v = (bool)((((byte)local_20 ^ bVar3) & bVar3) >> 7);
    (this->reg).sr.z = bVar3 == 0;
    (this->reg).sr.n = (bool)(bVar3 >> 7);
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,local_1c,val);
  }
  return;
}

Assistant:

void
Moira::execAddqEa(u16 opcode)
{
    i8  src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    if (src == 0) src = 8;
    result = addsub<I,S>(src, data);
    prefetch();

    writeOp<M,S, POLLIPL>(dst, ea, result);
}